

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# align_code.cpp
# Opt level: O1

void __thiscall
backend::codegen::CodeAlignOptimization::optimize_func
          (CodeAlignOptimization *this,Function *f,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint uVar3;
  mapped_type *__any;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *__ht;
  iterator iVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  pointer puVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  pointer puVar11;
  Inst *pIVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  __alloc_node_gen_t __alloc_node_gen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_str;
  mapped_type cycle_set;
  _Head_base<0UL,_arm::Inst_*,_false> local_e0;
  int local_d4;
  _Head_base<0UL,_arm::CtrlInst_*,_false> local_c8;
  bool local_bc [4];
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  local_b8;
  _func_int **local_a0;
  undefined1 local_98 [24];
  size_type local_80;
  _Prime_rehash_policy local_78;
  __node_base_ptr local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  __any = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::at(extra_data_repo,(key_type *)::optimization::CYCLE_START_DATA_NAME_abi_cxx11_);
  __ht = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)std::
            __any_caster<std::unordered_map<std::__cxx11::string,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>>
                      (__any);
  if (__ht == (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)0x0) {
    std::__throw_bad_any_cast();
  }
  local_98._0_8_ = (Inst *)0x0;
  local_98._8_8_ = __ht->_M_bucket_count;
  local_98._16_8_ = (_Hash_node_base *)0x0;
  local_80 = __ht->_M_element_count;
  local_78._M_max_load_factor = (__ht->_M_rehash_policy)._M_max_load_factor;
  local_78._4_4_ = *(undefined4 *)&(__ht->_M_rehash_policy).field_0x4;
  local_78._M_next_resize = (__ht->_M_rehash_policy)._M_next_resize;
  local_68 = (__node_base_ptr)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_98,__ht,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_true>_>_>
              *)&local_b8);
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_98,&f->name);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              *)((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_true>
                       ._M_cur + 0x28));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_98);
  local_b8.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar11 = (f->inst).
            super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (f->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar11) {
    lVar14 = 0;
    local_a0 = (_func_int **)&PTR_display_001f0750;
    uVar13 = 0;
    do {
      pIVar12 = puVar11[uVar13]._M_t.
                super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      if ((pIVar12 == (Inst *)0x0) || ((pIVar12->super_Displayable)._vptr_Displayable != local_a0))
      {
        pIVar12 = (Inst *)0x0;
      }
      if (pIVar12 != (Inst *)0x0) {
        pIVar12 = pIVar12 + 1;
        lVar5 = std::__cxx11::string::find((char *)pIVar12,0x1bb639,0);
        if (lVar5 == 0) {
          puVar8 = (f->inst).
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = 1;
          do {
            if (((ulong)((long)(f->inst).
                               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3) <=
                 uVar13 + lVar5) ||
               (*(int *)(*(long *)((long)&puVar8[lVar5]._M_t.
                                          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                          .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                  lVar14) + 8) - 1U < 5)) goto LAB_001727f6;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 7);
          lVar5 = 7;
LAB_001727f6:
          if (4 < (uint)lVar5) {
            std::__cxx11::string::find_last_of((char *)pIVar12,0x1bbfa4,0xffffffffffffffff);
            std::__cxx11::string::substr((ulong)local_98,(ulong)pIVar12);
            uVar7 = local_98._0_8_;
            piVar6 = __errno_location();
            local_d4 = *piVar6;
            *piVar6 = 0;
            lVar5 = strtol((char *)uVar7,(char **)&local_e0,10);
            if (local_e0._M_head_impl == (Inst *)uVar7) {
              uVar7 = std::__throw_invalid_argument("stoi");
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::~vector(&local_b8);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree(&local_60);
              _Unwind_Resume(uVar7);
            }
            uVar3 = (uint)lVar5;
            p_Var1 = &local_60._M_impl.super__Rb_tree_header;
            if (((int)uVar3 != lVar5) || (*piVar6 == 0x22)) {
              std::__throw_out_of_range("stoi");
            }
            p_Var9 = &p_Var1->_M_header;
            p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            if (*piVar6 == 0) {
              *piVar6 = local_d4;
            }
            for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
                p_Var2 = (&p_Var2->_M_left)[bVar15]) {
              bVar15 = (uint)*(size_t *)(p_Var2 + 1) < uVar3;
              if (!bVar15) {
                p_Var9 = p_Var2;
              }
            }
            p_Var10 = p_Var1;
            if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
               (p_Var10 = (_Rb_tree_header *)p_Var9,
               uVar3 < (uint)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
              p_Var10 = p_Var1;
            }
            if (p_Var10 != p_Var1) {
              local_bc[0] = true;
              local_bc[1] = false;
              local_bc[2] = false;
              local_bc[3] = false;
              std::make_unique<arm::CtrlInst,char_const(&)[6],int,bool>
                        ((char (*) [6])&local_c8,(int *)"align",local_bc);
              local_e0._M_head_impl = &(local_c8._M_head_impl)->super_Inst;
              local_c8._M_head_impl = (CtrlInst *)0x0;
              std::
              vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                        ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                          *)&local_b8,
                         (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_e0);
              if (local_e0._M_head_impl != (Inst *)0x0) {
                (*((local_e0._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
              }
              local_e0._M_head_impl = (Inst *)0x0;
              std::unique_ptr<arm::CtrlInst,_std::default_delete<arm::CtrlInst>_>::~unique_ptr
                        ((unique_ptr<arm::CtrlInst,_std::default_delete<arm::CtrlInst>_> *)&local_c8
                        );
            }
            if ((Inst *)local_98._0_8_ != (Inst *)(local_98 + 0x10)) {
              operator_delete((void *)local_98._0_8_,
                              (ulong)((long)(_Hash_node_base **)local_98._16_8_ + 1));
            }
          }
        }
      }
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&local_b8,puVar11 + uVar13);
      uVar13 = uVar13 + 1;
      puVar11 = (f->inst).
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = (f->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar14 = lVar14 + 8;
    } while (uVar13 < (ulong)((long)puVar8 - (long)puVar11 >> 3));
  }
  local_98._16_8_ =
       (f->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (f->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (f->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (f->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._0_8_ = puVar11;
  local_98._8_8_ = puVar8;
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)local_98);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::~vector(&local_b8);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void CodeAlignOptimization::optimize_func(
    arm::Function &f, std::map<std::string, std::any> &extra_data_repo) {
  auto cycle_set = std::any_cast<optimization::CycleStartType>(
                       extra_data_repo.at(optimization::CYCLE_START_DATA_NAME))
                       .at(f.name);
  std::vector<std::unique_ptr<arm::Inst>> inst_new;
  for (size_t index = 0; index < f.inst.size(); index++) {
    auto i = f.inst.begin() + index;
    if (auto x = dynamic_cast<arm::LabelInst *>(i->get())) {
      if (x->label.find(".bb_") == 0) {
        uint32_t cmpuInstNum;
        uint32_t totalInstNum;

        cmpuInstNum = 0;
        for (totalInstNum = 1;
             totalInstNum <= 6 && index + totalInstNum < f.inst.size();
             totalInstNum++) {
          arm::Inst *inst = (f.inst.begin() + index + totalInstNum)->get();
          if (inst->op == arm::OpCode::LdR || inst->op == arm::OpCode::LdM ||
              inst->op == arm::OpCode::StR || inst->op == arm::OpCode::StM ||
              inst->op == arm::OpCode::Push || inst->op == arm::OpCode::Pop) {
          } else if (inst->op == arm::OpCode::B ||
                     inst->op == arm::OpCode::Bl ||
                     inst->op == arm::OpCode::Bx ||
                     inst->op == arm::OpCode::Cbz ||
                     inst->op == arm::OpCode::Cbnz) {
            break;
          } else {
            cmpuInstNum++;
          }
        }

        if (totalInstNum >= 5) {
          try {
            auto bb_id_idx = x->label.find_last_of("$");
            auto id_str = x->label.substr(bb_id_idx + 1);
            auto bb_id = std::stoi(id_str);
            if (cycle_set.find(bb_id) != cycle_set.end()) {
              inst_new.push_back(std::make_unique<CtrlInst>("align", 7, true));
            }
          } catch (std::exception &i) {
          }
        }
      }
    }
    inst_new.push_back(std::move(*i));
  }
  f.inst = std::move(inst_new);
}